

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O3

sha256_hash *
libtorrent::merkle_root_scratch
          (sha256_hash *__return_storage_ptr__,span<const_libtorrent::digest32<256L>_> leaves,
          int num_leafs,sha256_hash pad,
          vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          *scratch_space)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  hasher256 *phVar6;
  pointer pdVar7;
  ulong uVar8;
  long lVar9;
  pointer pdVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  span<const_char> data;
  span<const_char> data_00;
  span<const_char> data_01;
  span<const_char> data_02;
  span<const_char> data_03;
  span<const_char> data_04;
  hasher256 hStack_78;
  uint local_6c;
  sha256_hash local_68;
  sha256_hash *local_48;
  pointer local_40;
  ulong local_38;
  
  uVar8 = leaves.m_len;
  pdVar10 = leaves.m_ptr;
  ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::resize
            (scratch_space,uVar8 + 1 >> 1);
  if (num_leafs == 1) {
    uVar2 = *(undefined8 *)(pdVar10->m_number)._M_elems;
    uVar3 = *(undefined8 *)((pdVar10->m_number)._M_elems + 2);
    uVar4 = *(undefined8 *)((pdVar10->m_number)._M_elems + 6);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 4) =
         *(undefined8 *)((pdVar10->m_number)._M_elems + 4);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 6) = uVar4;
    *(undefined8 *)(__return_storage_ptr__->m_number)._M_elems = uVar2;
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 2) = uVar3;
  }
  else {
    local_48 = __return_storage_ptr__;
    if (num_leafs < 2) {
      pdVar10 = (scratch_space->
                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      do {
        pdVar7 = pdVar10;
        uVar13 = 0;
        uVar5 = num_leafs;
        if (1 < (int)uVar8) {
          uVar5 = (int)(((uint)(uVar8 >> 0x1f) & 1) + (int)uVar8) >> 1;
          local_38 = (ulong)uVar5;
          uVar12 = (ulong)uVar5;
          lVar9 = 0;
          local_6c = num_leafs;
          local_40 = pdVar10;
          do {
            lcrypto::hasher256::hasher256(&hStack_78);
            data.m_len = 0x20;
            data.m_ptr = (char *)pdVar10;
            phVar6 = lcrypto::hasher256::update(&hStack_78,data);
            data_00.m_len = 0x20;
            data_00.m_ptr = (char *)(pdVar10 + 1);
            phVar6 = lcrypto::hasher256::update(phVar6,data_00);
            lcrypto::hasher256::final(&local_68,phVar6);
            pdVar7 = (scratch_space->
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (uint *)((long)(pdVar7->m_number)._M_elems + lVar9 + 0x10);
            *(undefined8 *)puVar1 = local_68.m_number._M_elems._16_8_;
            *(undefined8 *)(puVar1 + 2) = local_68.m_number._M_elems._24_8_;
            puVar1 = (uint *)((long)(pdVar7->m_number)._M_elems + lVar9);
            *(undefined8 *)puVar1 = local_68.m_number._M_elems._0_8_;
            *(undefined8 *)(puVar1 + 2) = local_68.m_number._M_elems._8_8_;
            lcrypto::hasher256::~hasher256(&hStack_78);
            pdVar10 = pdVar10 + 2;
            lVar9 = lVar9 + 0x20;
            uVar12 = uVar12 - 1;
            pdVar7 = local_40;
            uVar13 = local_38;
            uVar5 = local_6c;
          } while (uVar12 != 0);
        }
        uVar11 = (uint)uVar13;
        if ((uVar8 & 1) != 0) {
          lcrypto::hasher256::hasher256(&hStack_78);
          data_01.m_len = 0x20;
          data_01.m_ptr = (char *)(pdVar7 + uVar11 * 2);
          phVar6 = lcrypto::hasher256::update(&hStack_78,data_01);
          data_02.m_len = 0x20;
          data_02.m_ptr = (char *)&pad;
          phVar6 = lcrypto::hasher256::update(phVar6,data_02);
          lcrypto::hasher256::final(&local_68,phVar6);
          pdVar10 = (scratch_space->
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          puVar1 = pdVar10[uVar13 & 0xffffffff].m_number._M_elems + 4;
          *(undefined8 *)puVar1 = local_68.m_number._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = local_68.m_number._M_elems._24_8_;
          pdVar10 = pdVar10 + (uVar13 & 0xffffffff);
          *(undefined8 *)(pdVar10->m_number)._M_elems = local_68.m_number._M_elems._0_8_;
          *(undefined8 *)((pdVar10->m_number)._M_elems + 2) = local_68.m_number._M_elems._8_8_;
          lcrypto::hasher256::~hasher256(&hStack_78);
          uVar11 = uVar11 + 1;
        }
        lcrypto::hasher256::hasher256(&hStack_78);
        data_03.m_len = 0x20;
        data_03.m_ptr = (char *)&pad;
        phVar6 = lcrypto::hasher256::update(&hStack_78,data_03);
        data_04.m_len = 0x20;
        data_04.m_ptr = (char *)&pad;
        phVar6 = lcrypto::hasher256::update(phVar6,data_04);
        lcrypto::hasher256::final(&local_68,phVar6);
        pad.m_number._M_elems[4] = local_68.m_number._M_elems[4];
        pad.m_number._M_elems[5] = local_68.m_number._M_elems[5];
        pad.m_number._M_elems[6] = local_68.m_number._M_elems[6];
        pad.m_number._M_elems[7] = local_68.m_number._M_elems[7];
        pad.m_number._M_elems[0] = local_68.m_number._M_elems[0];
        pad.m_number._M_elems[1] = local_68.m_number._M_elems[1];
        pad.m_number._M_elems[2] = local_68.m_number._M_elems[2];
        pad.m_number._M_elems[3] = local_68.m_number._M_elems[3];
        lcrypto::hasher256::~hasher256(&hStack_78);
        pdVar10 = (scratch_space->
                  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (ulong)uVar11;
        num_leafs = uVar5 >> 1;
      } while (3 < uVar5);
    }
    uVar2 = *(undefined8 *)(pdVar10->m_number)._M_elems;
    uVar3 = *(undefined8 *)((pdVar10->m_number)._M_elems + 2);
    uVar4 = *(undefined8 *)((pdVar10->m_number)._M_elems + 6);
    *(undefined8 *)((local_48->m_number)._M_elems + 4) =
         *(undefined8 *)((pdVar10->m_number)._M_elems + 4);
    *(undefined8 *)((local_48->m_number)._M_elems + 6) = uVar4;
    *(undefined8 *)(local_48->m_number)._M_elems = uVar2;
    *(undefined8 *)((local_48->m_number)._M_elems + 2) = uVar3;
    __return_storage_ptr__ = local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

sha256_hash merkle_root_scratch(span<sha256_hash const> leaves
		, int num_leafs, sha256_hash pad
		, std::vector<sha256_hash>& scratch_space)
	{
		TORRENT_ASSERT(((num_leafs - 1) & num_leafs) == 0);

		scratch_space.resize(std::size_t(leaves.size() + 1) / 2);
		TORRENT_ASSERT(num_leafs > 0);

		if (num_leafs == 1) return leaves[0];

		while (num_leafs > 1)
		{
			int i = 0;
			for (; i < int(leaves.size()) / 2; ++i)
			{
				scratch_space[std::size_t(i)] = hasher256()
					.update(leaves[i * 2])
					.update(leaves[i * 2 + 1])
					.final();
			}
			if (leaves.size() & 1)
			{
				// if we have an odd number of leaves, compute the boundary hash
				// here, that spans both a payload-hash and a pad hash
				scratch_space[std::size_t(i)] = hasher256()
					.update(leaves[i * 2])
					.update(pad)
					.final();
				++i;
			}
			// we don't have to copy any pad hashes into memory, they are implied
			// just keep track of the current layer's pad hash
			pad = hasher256().update(pad).update(pad).final();

			// step one level up
			leaves = span<sha256_hash const>(scratch_space.data(), i);
			num_leafs /= 2;
		}

		return scratch_space[0];
	}